

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O3

int ikcp_wndsize(ikcpcb *kcp,int sndwnd,int rcvwnd)

{
  IUINT32 IVar1;
  
  if (kcp != (ikcpcb *)0x0) {
    if (0 < sndwnd) {
      kcp->snd_wnd = sndwnd;
    }
    if (0 < rcvwnd) {
      IVar1 = 0x80;
      if (0x80 < (uint)rcvwnd) {
        IVar1 = rcvwnd;
      }
      kcp->rcv_wnd = IVar1;
    }
  }
  return 0;
}

Assistant:

int ikcp_wndsize(ikcpcb *kcp, int sndwnd, int rcvwnd)
{
	if (kcp) {
		if (sndwnd > 0) {
			kcp->snd_wnd = sndwnd;
		}
		if (rcvwnd > 0) {   // must >= max fragment size
			kcp->rcv_wnd = _imax_(rcvwnd, IKCP_WND_RCV);
		}
	}
	return 0;
}